

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_mtree.c
# Opt level: O0

void test_read_format_mtree_nomagic_v2_netbsd_form(void)

{
  archive_entry *paVar1;
  FILE *__s;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  FILE *f;
  archive *a;
  archive_entry *ae;
  char buff [16];
  char reffile [38];
  char *in_stack_000003b0;
  archive *in_stack_ffffffffffffff98;
  archive_entry *paVar2;
  archive_entry **ppaVar3;
  archive *in_stack_ffffffffffffffa0;
  uint uVar5;
  archive *paVar4;
  char *in_stack_ffffffffffffffa8;
  char *pcVar6;
  archive *in_stack_ffffffffffffffb0;
  wchar_t line;
  undefined4 local_40;
  wchar_t in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  archive *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  void *in_stack_fffffffffffffff8;
  
  memcpy(&stack0xffffffffffffffd8,"test_read_format_mtree_nomagic3.mtree",0x26);
  extract_reference_file(in_stack_000003b0);
  paVar1 = (archive_entry *)archive_read_new();
  assertion_assert((char *)in_stack_ffffffffffffffb0,
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
  archive_read_support_filter_all(in_stack_ffffffffffffff98);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)paVar1,(char *)0x18fff0,in_stack_ffffffffffffffd0);
  archive_read_support_format_all((archive *)paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)paVar2,(char *)0x190029,in_stack_ffffffffffffffd0);
  archive_read_set_options(in_stack_ffffffffffffffa0,(char *)paVar2);
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)paVar1,(char *)0x190069,in_stack_ffffffffffffffd0);
  archive_read_open_filename
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)paVar1,(char *)0x1900ac,in_stack_ffffffffffffffd0);
  __s = fopen("file","wb");
  assertion_assert((char *)__s,(wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,paVar1);
  fwrite("hi\n",1,3,__s);
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,0,
                      (char *)0x19013b,in_stack_ffffffffffffffd0);
  fclose(__s);
  archive_read_next_header(in_stack_ffffffffffffffa0,ppaVar3);
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)paVar2,(char *)0x190183,in_stack_ffffffffffffffd0);
  archive_format((archive *)paVar2);
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,0,
                      (char *)0x1901bf,in_stack_ffffffffffffffd0);
  uVar5 = (uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  archive_entry_pathname(paVar1);
  pcVar6 = (char *)((ulong)uVar5 << 0x20);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             in_stack_ffffffffffffffa8,pcVar6,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_uid((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,pcVar6,0,(char *)0x190242,
                      in_stack_ffffffffffffffd0);
  archive_entry_filetype((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,pcVar6,0,(char *)0x19027f,
                      in_stack_ffffffffffffffd0);
  archive_entry_mode((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,pcVar6,0,(char *)0x1902bc,
                      in_stack_ffffffffffffffd0);
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,pcVar6,0,(char *)0x1902f8,
                      in_stack_ffffffffffffffd0);
  archive_read_data(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    (size_t)in_stack_ffffffffffffffc8);
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,pcVar6,0,(char *)0x19033d,
                      in_stack_ffffffffffffffd0);
  ppaVar3 = (archive_entry **)0x3;
  paVar4 = (archive *)0x2eb605;
  pcVar6 = (char *)0x0;
  assertion_equal_mem(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                      in_stack_fffffffffffffff0,
                      (void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe0,(size_t)a,(char *)ae,(void *)buff._0_8_);
  archive_read_next_header(paVar4,ppaVar3);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)pcVar6,(char *)paVar4,
                      (longlong)paVar2,(char *)0x1903c6,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar2);
  paVar4 = (archive *)((ulong)paVar4 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar1,(char *)__s,pcVar6,
             (char *)paVar4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_mode((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)pcVar6,(char *)paVar4,0
                      ,(char *)0x19044a,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar4,ppaVar3);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)pcVar6,(char *)paVar4,
                      (longlong)paVar1,(char *)0x190488,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar4 = (archive *)((ulong)paVar4 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,pcVar6,
             (char *)paVar4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_uid((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)pcVar6,(char *)paVar4,0
                      ,(char *)0x19050b,in_stack_ffffffffffffffd0);
  archive_entry_mode((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)pcVar6,(char *)paVar4,0
                      ,(char *)0x190548,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar4,ppaVar3);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)pcVar6,(char *)paVar4,
                      (longlong)paVar2,(char *)0x190586,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar2);
  paVar4 = (archive *)((ulong)paVar4 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar1,(char *)__s,pcVar6,
             (char *)paVar4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_mode((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)pcVar6,(char *)paVar4,0
                      ,(char *)0x19060a,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar4,ppaVar3);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)pcVar6,(char *)paVar4,
                      (longlong)paVar1,(char *)0x190648,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar4 = (archive *)((ulong)paVar4 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,pcVar6,
             (char *)paVar4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_mode((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)pcVar6,(char *)paVar4,0
                      ,(char *)0x1906cc,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar4,ppaVar3);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)pcVar6,(char *)paVar4,
                      (longlong)paVar2,(char *)0x19070a,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar2);
  paVar4 = (archive *)((ulong)paVar4 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar1,(char *)__s,pcVar6,
             (char *)paVar4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  line = (wchar_t)((ulong)__s >> 0x20);
  archive_entry_mode((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  ppaVar3 = (archive_entry **)0x0;
  assertion_equal_int((char *)paVar1,line,(longlong)pcVar6,(char *)paVar4,0,(char *)0x19078e,
                      in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar4,ppaVar3);
  assertion_equal_int((char *)paVar1,line,(longlong)pcVar6,(char *)paVar4,(longlong)paVar1,
                      (char *)0x1907cd,in_stack_ffffffffffffffd0);
  archive_file_count((archive *)paVar1);
  assertion_equal_int((char *)paVar1,line,(longlong)pcVar6,(char *)paVar4,0,(char *)0x190808,
                      in_stack_ffffffffffffffd0);
  archive_read_close((archive *)0x190812);
  assertion_equal_int((char *)paVar1,line,(longlong)pcVar6,(char *)paVar4,0,(char *)0x190840,
                      in_stack_ffffffffffffffd0);
  archive_read_free((archive *)0x19084a);
  assertion_equal_int((char *)paVar1,line,(longlong)pcVar6,(char *)paVar4,0,(char *)0x190878,
                      in_stack_ffffffffffffffd0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_mtree_nomagic_v2_netbsd_form)
{
	const char reffile[] = "test_read_format_mtree_nomagic3.mtree";
	char buff[16];
	struct archive_entry *ae;
	struct archive *a;
	FILE *f;

	extract_reference_file(reffile);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "mtree:checkfs"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, reffile, 11));

	/*
	 * Read "file", whose data is available on disk.
	 */
	f = fopen("file", "wb");
	assert(f != NULL);
	assertEqualInt(3, fwrite("hi\n", 1, 3, f));
	fclose(f);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_MTREE);
	assertEqualString(archive_entry_pathname(ae), "./file");
	assertEqualInt(archive_entry_uid(ae), 18);
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0123);
	assertEqualInt(archive_entry_size(ae), 3);
	assertEqualInt(3, archive_read_data(a, buff, 3));
	assertEqualMem(buff, "hi\n", 3);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./dir");
	assertEqualInt(archive_entry_mode(ae), AE_IFDIR | 0755);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./dir/file with space");
	assertEqualInt(archive_entry_uid(ae), 18);
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./file with space");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./dir2");
	assertEqualInt(archive_entry_mode(ae), AE_IFDIR | 0755);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./dir2/dir3a");
	assertEqualInt(archive_entry_mode(ae), AE_IFDIR | 0755);

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_file_count(a));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}